

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSimpleConfigCase.cpp
# Opt level: O0

void __thiscall deqp::egl::SimpleConfigCase::deinit(SimpleConfigCase *this)

{
  Library *pLVar1;
  SimpleConfigCase *this_local;
  
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar1->_vptr_Library[0x34])(pLVar1,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  std::vector<void_*,_std::allocator<void_*>_>::clear(&this->m_configs);
  return;
}

Assistant:

void SimpleConfigCase::deinit (void)
{
	if (m_display != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
	m_configs.clear();
}